

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

LY_ERR xml_print_opaq_open(xmlpr_ctx *pctx,lyd_node_opaq *node)

{
  uint local_34;
  LY_ERR ret__;
  lyd_node_opaq *node_local;
  xmlpr_ctx *pctx_local;
  
  if ((pctx->options & 2) == 0) {
    local_34 = (uint)pctx->level << 1;
  }
  else {
    local_34 = 0;
  }
  ly_print_(pctx->out,"%*s<%s",(ulong)local_34,"",(node->name).name);
  if (((node->name).prefix != (char *)0x0) || ((node->name).field_2.module_ns != (char *)0x0)) {
    xml_print_ns_opaq(pctx,node->format,&node->name,2);
  }
  pctx_local._4_4_ = xml_print_attr(pctx,node);
  if (pctx_local._4_4_ == LY_SUCCESS) {
    pctx_local._4_4_ = LY_SUCCESS;
  }
  return pctx_local._4_4_;
}

Assistant:

static LY_ERR
xml_print_opaq_open(struct xmlpr_ctx *pctx, const struct lyd_node_opaq *node)
{
    /* print node name */
    ly_print_(pctx->out, "%*s<%s", INDENT, node->name.name);

    if (node->name.prefix || node->name.module_ns) {
        /* print default namespace */
        xml_print_ns_opaq(pctx, node->format, &node->name, LYXML_PREFIX_DEFAULT);
    }

    /* print attributes */
    LY_CHECK_RET(xml_print_attr(pctx, node));

    return LY_SUCCESS;
}